

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall
fmt::v11::format_facet<std::locale>::format_facet(format_facet<std::locale> *this,locale *loc)

{
  char __c;
  ulong uVar1;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [48];
  numpunct *local_20;
  numpunct<char> *np;
  locale *loc_local;
  format_facet<std::locale> *this_local;
  
  np = (numpunct<char> *)loc;
  loc_local = (locale *)this;
  std::locale::facet::facet(&this->super_facet,0);
  *(undefined ***)this = &PTR__format_facet_00468bd8;
  std::__cxx11::string::string((string *)&this->separator_);
  std::__cxx11::string::string((string *)&this->grouping_);
  std::__cxx11::string::string((string *)&this->decimal_point_);
  local_20 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)np);
  std::__cxx11::numpunct<char>::grouping();
  std::__cxx11::string::operator=((string *)&this->grouping_,local_50);
  std::__cxx11::string::~string(local_50);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __c = std::__cxx11::numpunct<char>::thousands_sep();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,1,__c,&local_71);
    std::__cxx11::string::operator=((string *)&this->separator_,local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return;
}

Assistant:

format_facet<Locale>::format_facet(Locale& loc) {
  auto& np = detail::use_facet<detail::numpunct<char>>(loc);
  grouping_ = np.grouping();
  if (!grouping_.empty()) separator_ = std::string(1, np.thousands_sep());
}